

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

void helper_vbpermq_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  uint64_t uVar4;
  ulong uVar5;
  
  bVar3 = 0xf;
  lVar2 = 0;
  uVar4 = 0;
  do {
    bVar1 = b->u8[lVar2];
    if (-1 < (char)bVar1) {
      uVar5 = 0;
      if ((a->u64[bVar1 < 0x40] >> ((ulong)(byte)~bVar1 & 0x3f) & 1) != 0) {
        uVar5 = (ulong)(0x8000 >> (bVar3 & 0x1f));
      }
      uVar4 = uVar4 | uVar5;
    }
    lVar2 = lVar2 + 1;
    bVar3 = bVar3 - 1;
  } while (lVar2 != 0x10);
  r->u64[1] = uVar4;
  r->u64[0] = 0;
  return;
}

Assistant:

void helper_vbpermq(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    int i;
    uint64_t perm = 0;

    VECTOR_FOR_INORDER_I(i, u8) {
        int index = VBPERMQ_INDEX(b, i);

        if (index < 128) {
            uint64_t mask = (1ull << (63 - (index & 0x3F)));
            if (a->u64[VBPERMQ_DW(index)] & mask) {
                perm |= (0x8000 >> i);
            }
        }
    }

    r->VsrD(0) = perm;
    r->VsrD(1) = 0;
}